

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void calculatePaintColors58H(uint8 d,uint8 p,uint8 (*colors) [3],uint8 (*possible_colors) [3])

{
  byte bVar1;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  uint8 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  bVar1 = "\x03\x06\v\x10\x17 )@"[CONCAT71(in_register_00000039,d) & 0xffffffff];
  iVar3 = (uint)colors[1][0] - (uint)bVar1;
  uVar2 = (uint8)iVar3;
  if (iVar3 < 1) {
    uVar2 = '\0';
  }
  possible_colors[3][0] = uVar2;
  iVar3 = (uint)colors[1][1] - (uint)bVar1;
  uVar2 = (uint8)iVar3;
  if (iVar3 < 1) {
    uVar2 = '\0';
  }
  possible_colors[3][1] = uVar2;
  uVar5 = (uint)bVar1;
  iVar3 = colors[1][2] - uVar5;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  possible_colors[3][2] = (uint8)iVar3;
  if ((int)CONCAT71(in_register_00000031,p) == 0) {
    uVar4 = (*colors)[0] + uVar5;
    uVar2 = (uint8)uVar4;
    if (0xfe < uVar4) {
      uVar2 = 0xff;
    }
    (*possible_colors)[0] = uVar2;
    uVar4 = (*colors)[1] + uVar5;
    uVar2 = (uint8)uVar4;
    if (0xfe < uVar4) {
      uVar2 = 0xff;
    }
    (*possible_colors)[1] = uVar2;
    uVar5 = (*colors)[2] + uVar5;
    uVar2 = (uint8)uVar5;
    if (0xfe < uVar5) {
      uVar2 = 0xff;
    }
    (*possible_colors)[2] = uVar2;
    uVar5 = (uint)bVar1;
    iVar3 = (*colors)[0] - uVar5;
    uVar2 = (uint8)iVar3;
    if (iVar3 < 1) {
      uVar2 = '\0';
    }
    possible_colors[1][0] = uVar2;
    iVar3 = (*colors)[1] - uVar5;
    uVar2 = (uint8)iVar3;
    if (iVar3 < 1) {
      uVar2 = '\0';
    }
    possible_colors[1][1] = uVar2;
    iVar3 = (*colors)[2] - uVar5;
    uVar2 = (uint8)iVar3;
    if (iVar3 < 1) {
      uVar2 = '\0';
    }
    possible_colors[1][2] = uVar2;
    uVar4 = colors[1][0] + uVar5;
    uVar2 = (uint8)uVar4;
    if (0xfe < uVar4) {
      uVar2 = 0xff;
    }
    possible_colors[2][0] = uVar2;
    uVar4 = colors[1][1] + uVar5;
    uVar2 = (uint8)uVar4;
    if (0xfe < uVar4) {
      uVar2 = 0xff;
    }
    possible_colors[2][1] = uVar2;
    uVar5 = colors[1][2] + uVar5;
    uVar2 = (uint8)uVar5;
    if (0xfe < uVar5) {
      uVar2 = 0xff;
    }
    possible_colors[2][2] = uVar2;
    return;
  }
  printf("Invalid pattern. Terminating");
  exit(1);
}

Assistant:

void calculatePaintColors58H(uint8 d, uint8 p, uint8 (colors)[2][3], uint8 (possible_colors)[4][3]) 
{
	
	//////////////////////////////////////////////
	//
	//		C3      C1		C4----C1---C2
	//		|		|			  |
	//		|		|			  |
	//		|-------|			  |
	//		|		|			  |
	//		|		|			  |
	//		C4      C2			  C3
	//
	//////////////////////////////////////////////

	// C4
	possible_colors[3][R] = CLAMP(0,colors[1][R] - table58H[d],255);
	possible_colors[3][G] = CLAMP(0,colors[1][G] - table58H[d],255);
	possible_colors[3][B] = CLAMP(0,colors[1][B] - table58H[d],255);
	
	if (p == PATTERN_H) 
	{ 
		// C1
		possible_colors[0][R] = CLAMP(0,colors[0][R] + table58H[d],255);
		possible_colors[0][G] = CLAMP(0,colors[0][G] + table58H[d],255);
		possible_colors[0][B] = CLAMP(0,colors[0][B] + table58H[d],255);
		// C2
		possible_colors[1][R] = CLAMP(0,colors[0][R] - table58H[d],255);
		possible_colors[1][G] = CLAMP(0,colors[0][G] - table58H[d],255);
		possible_colors[1][B] = CLAMP(0,colors[0][B] - table58H[d],255);
		// C3
		possible_colors[2][R] = CLAMP(0,colors[1][R] + table58H[d],255);
		possible_colors[2][G] = CLAMP(0,colors[1][G] + table58H[d],255);
		possible_colors[2][B] = CLAMP(0,colors[1][B] + table58H[d],255);
	} 
	else 
	{
		printf("Invalid pattern. Terminating");
		exit(1);
	}
}